

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  byte *pbVar1;
  ENetBuffer *buffers;
  ENetList *pEVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  short sVar6;
  short sVar7;
  enet_uint32 eVar8;
  ENetPeer *peer;
  _ENetListNode *p_Var9;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var10;
  ENetChecksumCallback p_Var11;
  size_t sVar12;
  ENetPacket *pEVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  _ENetListNode *p_Var17;
  bool bVar18;
  ENetEvent *pEVar19;
  ushort uVar20;
  int iVar21;
  void *pvVar22;
  undefined8 *puVar23;
  size_t sVar24;
  long *plVar25;
  uint uVar26;
  enet_uint32 eVar27;
  long lVar28;
  ENetListIterator pEVar29;
  _ENetListNode *p_Var30;
  enet_uint32 eVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  enet_uint8 headerData [10];
  uint local_6c;
  ushort local_68;
  ENetEvent *local_60;
  enet_uint8 (*local_58) [4096];
  ENetBuffer *local_50;
  ENetProtocol *local_48;
  ENetListIterator local_40;
  _ENetListNode *local_38;
  
  host->continueSending = 1;
  local_48 = host->commands;
  buffers = host->buffers;
  local_50 = host->buffers + 1;
  local_58 = host->packetData + 1;
  local_60 = event;
  do {
    host->continueSending = 0;
    if (host->peerCount != 0) {
      uVar36 = 0;
      do {
        peer = host->peer_list[uVar36];
        if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE)
           ) {
          host->headerFlags = 0;
          host->commandCount = 0;
          host->bufferCount = 1;
          host->packetSize = 6;
          p_Var30 = (peer->acknowledgements).sentinel.next;
          if (p_Var30 != &(peer->acknowledgements).sentinel) {
            lVar28 = 0x6c8;
            uVar34 = 0x6c;
            do {
              if (0x6ab < uVar34) {
                lVar28 = 0x8c8;
                uVar34 = 0x6ac;
LAB_00105461:
                host->continueSending = 1;
                break;
              }
              sVar24 = host->packetSize;
              if (peer->mtu - sVar24 < 8) goto LAB_00105461;
              p_Var9 = p_Var30->next;
              *(ulong *)((long)host->commands + lVar28 + -0x6c) =
                   (long)host->commands + (uVar34 - 0x6c);
              *(undefined8 *)((long)host->commands + lVar28 + -100) = 8;
              host->packetSize = sVar24 + 8;
              uVar20 = *(ushort *)((long)&p_Var30[1].next + 6);
              uVar20 = uVar20 << 8 | uVar20 >> 8;
              *(undefined1 *)((long)host->commands + (uVar34 - 0x6c)) = 1;
              *(undefined1 *)((long)host->commands + (uVar34 - 0x6b)) =
                   *(undefined1 *)((long)&p_Var30[1].next + 5);
              *(ushort *)((long)host->commands + (uVar34 - 0x6a)) = uVar20;
              *(ushort *)((long)host->commands + (uVar34 - 0x68)) = uVar20;
              *(ushort *)((long)host->commands + (uVar34 - 0x66)) =
                   *(ushort *)&p_Var30[1].next << 8 | *(ushort *)&p_Var30[1].next >> 8;
              if (((ulong)p_Var30[1].next & 0xf00000000) == 0x400000000) {
                enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
              }
              enet_list_remove(p_Var30);
              enet_free(p_Var30);
              uVar34 = uVar34 + 0x32;
              lVar28 = lVar28 + 0x10;
              p_Var30 = p_Var9;
            } while (p_Var9 != &(peer->acknowledgements).sentinel);
            host->commandCount = ((long)(uVar34 - 0x6c) >> 1) * -0x70a3d70a3d70a3d7;
            host->bufferCount = lVar28 + -0x6b8 >> 4;
          }
          if (checkForTimeouts != 0) {
            pEVar2 = &peer->sentReliableCommands;
            p_Var30 = (peer->sentReliableCommands).sentinel.next;
            if ((p_Var30 != &pEVar2->sentinel) && (host->serviceTime - peer->nextTimeout < 86400000)
               ) {
              pEVar29 = (peer->outgoingReliableCommands).sentinel.next;
              do {
                pEVar19 = local_60;
                p_Var9 = p_Var30->next;
                eVar27 = host->serviceTime;
                eVar8 = *(enet_uint32 *)((long)&p_Var30[1].next + 4);
                uVar32 = eVar8 - eVar27;
                if (eVar27 - eVar8 < 86400000) {
                  uVar32 = eVar27 - eVar8;
                }
                uVar26 = *(uint *)&p_Var30[1].previous;
                if (uVar26 <= uVar32) {
                  if ((peer->earliestTimeout == 0) || (86399999 < eVar8 - peer->earliestTimeout)) {
                    peer->earliestTimeout = eVar8;
                  }
                  eVar8 = peer->earliestTimeout;
                  if (eVar8 != 0) {
                    uVar32 = eVar8 - eVar27;
                    if (eVar27 - eVar8 < 86400000) {
                      uVar32 = eVar27 - eVar8;
                    }
                    if ((peer->timeoutMaximum <= uVar32) ||
                       ((*(uint *)((long)&p_Var30[1].previous + 4) <= uVar26 &&
                        (peer->timeoutMinimum <= uVar32)))) {
                      enet_protocol_notify_disconnect(host,peer,local_60);
                      if ((pEVar19 != (ENetEvent *)0x0) && (local_60->type != ENET_EVENT_TYPE_NONE))
                      {
                        return 1;
                      }
                      goto LAB_00105b18;
                    }
                  }
                  if (p_Var30[6].next != (_ENetListNode *)0x0) {
                    peer->reliableDataInTransit =
                         peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var30[2].next + 4)
                    ;
                  }
                  peer->packetsLost = peer->packetsLost + 1;
                  *(uint *)&p_Var30[1].previous = uVar26 * 2;
                  pvVar22 = enet_list_remove(p_Var30);
                  enet_list_insert(pEVar29,pvVar22);
                  p_Var30 = (peer->sentReliableCommands).sentinel.next;
                  if (p_Var30 != &pEVar2->sentinel && p_Var9 == p_Var30) {
                    peer->nextTimeout =
                         *(int *)&p_Var9[1].previous + *(int *)((long)&p_Var9[1].next + 4);
                  }
                }
                p_Var30 = p_Var9;
              } while (p_Var9 != &pEVar2->sentinel);
            }
          }
          if ((((peer->outgoingReliableCommands).sentinel.next ==
                &(peer->outgoingReliableCommands).sentinel) ||
              (iVar21 = enet_protocol_send_reliable_outgoing_commands(host,peer), iVar21 != 0)) &&
             ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel))
          {
            uVar26 = host->serviceTime - peer->lastReceiveTime;
            uVar32 = peer->lastReceiveTime - host->serviceTime;
            if (uVar26 < 86400000) {
              uVar32 = uVar26;
            }
            if ((peer->pingInterval <= uVar32) && (3 < (ulong)peer->mtu - host->packetSize)) {
              enet_peer_ping(peer);
              enet_protocol_send_reliable_outgoing_commands(host,peer);
            }
          }
          pEVar2 = &peer->outgoingUnreliableCommands;
          p_Var30 = (peer->outgoingUnreliableCommands).sentinel.next;
          if (p_Var30 != &pEVar2->sentinel) {
            lVar35 = host->commandCount * 0x32 + 0x6c;
            lVar28 = host->bufferCount * 0x10 + 0x6b8;
            local_40 = &(peer->sentUnreliableCommands).sentinel;
            local_38 = &(peer->outgoingReliableCommands).sentinel;
            do {
              plVar25 = (long *)((long)host->commands + lVar28 + -0x6c);
              puVar23 = (undefined8 *)((long)host->commands + lVar35 + -0x6c);
              if (p_Var30 == &pEVar2->sentinel) goto LAB_00105823;
              if ((lVar35 < 0x6ac) && (lVar28 < 0xab8)) {
                uVar34 = commandSizes[*(byte *)&p_Var30[2].previous & 0xf];
                sVar24 = host->packetSize;
                uVar33 = peer->mtu - sVar24;
                if ((uVar33 < uVar34) ||
                   ((p_Var30[6].next != (_ENetListNode *)0x0 &&
                    (uVar33 < *(ushort *)((long)&p_Var30[2].next + 4) + uVar34))))
                goto LAB_001056ca;
                pEVar29 = p_Var30->next;
                if (((p_Var30[6].next == (_ENetListNode *)0x0) || (*(int *)&p_Var30[2].next != 0))
                   || (uVar32 = peer->packetThrottleCounter + 7 & 0x1f,
                      peer->packetThrottleCounter = uVar32, uVar32 <= peer->packetThrottle)) {
                  *plVar25 = (long)puVar23;
                  plVar25[1] = uVar34;
                  host->packetSize = sVar24 + uVar34;
                  *(undefined2 *)(puVar23 + 6) = *(undefined2 *)&p_Var30[5].previous;
                  p_Var9 = p_Var30[2].previous;
                  p_Var17 = p_Var30[3].next;
                  auVar5 = *(undefined1 (*) [16])&p_Var30[3].previous;
                  uVar14 = *(undefined4 *)((long)&p_Var30[4].previous + 4);
                  uVar15 = *(undefined4 *)&p_Var30[5].next;
                  uVar16 = *(undefined4 *)((long)&p_Var30[5].next + 4);
                  *(undefined4 *)(puVar23 + 4) = *(undefined4 *)&p_Var30[4].previous;
                  *(undefined4 *)((long)puVar23 + 0x24) = uVar14;
                  *(undefined4 *)(puVar23 + 5) = uVar15;
                  *(undefined4 *)((long)puVar23 + 0x2c) = uVar16;
                  *(undefined1 (*) [16])(puVar23 + 2) = auVar5;
                  *puVar23 = p_Var9;
                  puVar23[1] = p_Var17;
                  enet_list_remove(p_Var30);
                  if (p_Var30[6].next == (_ENetListNode *)0x0) {
                    enet_free(p_Var30);
                  }
                  else {
                    *(ulong *)((long)host->commands + lVar28 + -0x5c) =
                         (long)&(p_Var30[6].next[1].next)->next + (ulong)*(uint *)&p_Var30[2].next;
                    uVar34 = (ulong)*(ushort *)((long)&p_Var30[2].next + 4);
                    *(ulong *)((long)host->commands + lVar28 + -0x54) = uVar34;
                    host->packetSize = host->packetSize + uVar34;
                    enet_list_insert(local_40,p_Var30);
                    lVar28 = lVar28 + 0x10;
                  }
                  lVar35 = lVar35 + 0x32;
                  lVar28 = lVar28 + 0x10;
                  bVar18 = false;
                }
                else {
                  sVar6 = *(short *)&p_Var30[1].next;
                  sVar7 = *(short *)((long)&p_Var30[1].next + 2);
                  while( true ) {
                    pEVar13 = (ENetPacket *)p_Var30[6].next;
                    pEVar13->referenceCount = pEVar13->referenceCount - 1;
                    if (pEVar13->referenceCount == 0) {
                      enet_packet_destroy(pEVar13);
                    }
                    enet_list_remove(p_Var30);
                    enet_free(p_Var30);
                    if (((pEVar29 == &pEVar2->sentinel) || (*(short *)&pEVar29[1].next != sVar6)) ||
                       (*(short *)((long)&pEVar29[1].next + 2) != sVar7)) break;
                    p_Var30 = pEVar29;
                    pEVar29 = pEVar29->next;
                  }
                  bVar18 = false;
                }
              }
              else {
LAB_001056ca:
                host->continueSending = 1;
                bVar18 = true;
                pEVar29 = p_Var30;
              }
              p_Var30 = pEVar29;
            } while (!bVar18);
            plVar25 = (long *)((long)host->commands + lVar28 + -0x6c);
            puVar23 = (undefined8 *)((long)host->commands + lVar35 + -0x6c);
LAB_00105823:
            host->commandCount = ((long)puVar23 - (long)local_48 >> 1) * -0x70a3d70a3d70a3d7;
            host->bufferCount = (long)plVar25 - (long)buffers >> 4;
            if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                (((ENetListNode *)&local_38->next)->next == local_38)) &&
               (((pEVar2->sentinel).next == &pEVar2->sentinel &&
                ((peer->sentReliableCommands).sentinel.next ==
                 &(peer->sentReliableCommands).sentinel)))) {
              enet_peer_disconnect(peer,peer->eventData);
            }
          }
          if (host->commandCount != 0) {
            eVar27 = peer->packetLossEpoch;
            if (eVar27 == 0) {
              peer->packetLossEpoch = host->serviceTime;
            }
            else {
              eVar8 = host->serviceTime;
              uVar32 = eVar27 - eVar8;
              if (eVar8 - eVar27 < 86400000) {
                uVar32 = eVar8 - eVar27;
              }
              if ((9999 < uVar32) && (peer->packetsSent != 0)) {
                uVar32 = peer->packetLoss;
                uVar26 = (peer->packetsLost << 0x10) / peer->packetsSent;
                eVar27 = peer->packetLossVariance - (peer->packetLossVariance >> 2);
                peer->packetLossVariance = eVar27;
                if (uVar26 < uVar32) {
                  eVar31 = uVar32 - (uVar32 - uVar26 >> 3);
                  peer->packetLoss = eVar31;
                  uVar26 = eVar31 - uVar26;
                }
                else {
                  eVar31 = (uVar26 - uVar32 >> 3) + uVar32;
                  peer->packetLoss = eVar31;
                  uVar26 = uVar26 - eVar31;
                }
                peer->packetLossVariance = (uVar26 >> 2) + eVar27;
                peer->packetLossEpoch = eVar8;
                peer->packetsSent = 0;
                peer->packetsLost = 0;
              }
            }
            host->buffers[0].data = &local_6c;
            if ((host->headerFlags & 0x8000000) == 0) {
              host->buffers[0].dataLength = 4;
            }
            else {
              uVar20 = (ushort)host->serviceTime;
              local_68 = uVar20 << 8 | uVar20 >> 8;
              host->buffers[0].dataLength = 6;
            }
            pvVar22 = (host->compressor).context;
            if ((pvVar22 == (void *)0x0) ||
               (p_Var10 = (host->compressor).compress,
               p_Var10 ==
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0)) {
LAB_00105a03:
              sVar24 = 0;
            }
            else {
              uVar34 = host->packetSize - 6;
              sVar24 = (*p_Var10)(pvVar22,local_50,host->bufferCount - 1,uVar34,*local_58,uVar34);
              if (uVar34 <= sVar24 || sVar24 == 0) goto LAB_00105a03;
              pbVar1 = (byte *)((long)&host->headerFlags + 3);
              *pbVar1 = *pbVar1 | 4;
            }
            uVar32 = peer->outgoingPeerID;
            if (uVar32 < 0xffffff) {
              iVar21._0_1_ = peer->outgoingSessionID;
              iVar21._1_1_ = peer->incomingSessionID;
              iVar21._2_2_ = *(undefined2 *)&peer->field_0x26;
              host->headerFlags = host->headerFlags | iVar21 << 0x18;
            }
            uVar26 = host->headerFlags | uVar32;
            local_6c = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                       uVar26 << 0x18;
            p_Var11 = host->checksum;
            if (p_Var11 != (ENetChecksumCallback)0x0) {
              eVar27 = 0;
              if (uVar32 < 0xffffff) {
                eVar27 = peer->connectID;
              }
              sVar12 = host->buffers[0].dataLength;
              *(enet_uint32 *)((long)&local_6c + sVar12) = eVar27;
              host->buffers[0].dataLength = sVar12 + 4;
              eVar27 = (*p_Var11)(buffers,host->bufferCount);
              *(enet_uint32 *)((long)&local_6c + sVar12) = eVar27;
            }
            if (sVar24 != 0) {
              host->buffers[1].data = local_58;
              host->buffers[1].dataLength = sVar24;
              host->bufferCount = 2;
            }
            peer->lastSendTime = host->serviceTime;
            iVar21 = enet_socket_send(host->socket,&peer->address,buffers,host->bufferCount);
            p_Var30 = (peer->sentUnreliableCommands).sentinel.next;
            while (p_Var30 != &(peer->sentUnreliableCommands).sentinel) {
              enet_list_remove(p_Var30);
              pEVar13 = (ENetPacket *)p_Var30[6].next;
              if ((pEVar13 != (ENetPacket *)0x0) &&
                 (pEVar13->referenceCount = pEVar13->referenceCount - 1,
                 pEVar13->referenceCount == 0)) {
                pbVar1 = (byte *)((long)&pEVar13->flags + 1);
                *pbVar1 = *pbVar1 | 1;
                enet_packet_destroy(pEVar13);
              }
              enet_free(p_Var30);
              p_Var30 = (peer->sentUnreliableCommands).sentinel.next;
            }
            if (iVar21 < 0) {
              return -1;
            }
            uVar3 = host->totalSentData;
            uVar4 = host->totalSentPackets;
            host->totalSentData = iVar21 + uVar3;
            host->totalSentPackets = uVar4 + 1;
          }
        }
LAB_00105b18:
        uVar36 = uVar36 + 1;
      } while (uVar36 < host->peerCount);
    }
    if (host->continueSending == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
    int i;

    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
	     i = 0; i < host -> peerCount; i++ )
    {
	currentPeer = host -> peer_list[i];
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingReliableCommands) ||
              enet_protocol_send_reliable_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_send_reliable_outgoing_commands (host, currentPeer);
        }
                      
        if (! enet_list_empty (& currentPeer -> outgoingUnreliableCommands))
          enet_protocol_send_unreliable_outgoing_commands (host, currentPeer);

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u/%u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingReliableCommands), enet_list_size (& currentPeer -> outgoingUnreliableCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif
          
           currentPeer -> packetLossVariance -= currentPeer -> packetLossVariance / 4;

           if (packetLoss >= currentPeer -> packetLoss)
           {
              currentPeer -> packetLoss += (packetLoss - currentPeer -> packetLoss) / 8;
              currentPeer -> packetLossVariance += (packetLoss - currentPeer -> packetLoss) / 4;
           }
           else
           {
              currentPeer -> packetLoss -= (currentPeer -> packetLoss - packetLoss) / 8;
              currentPeer -> packetLossVariance += (currentPeer -> packetLoss - packetLoss) / 4;
           }

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_32 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}